

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int pigpio_start(char *addrStr,char *portStr)

{
  int fd;
  
  if ((addrStr == (char *)0x0) || (*addrStr == '\0')) {
    addrStr = "localhost";
  }
  fd = 0;
  if (((gPigStarted == '\0') && (fd = pigpioOpenSocket(addrStr,portStr), gPigCommand = fd, -1 < fd))
     && (fd = pigpioOpenSocket(addrStr,portStr), gPigNotify = fd, -1 < fd)) {
    gPigHandle = pigpio_command(fd,99,0,0,1);
    if (gPigHandle < 0) {
      fd = -0x7d5;
    }
    else {
      fd = 0;
      gLastLevel = pigpio_command(gPigCommand,10,0,0,1);
      pthNotify = start_thread(pthNotifyThread,(void *)0x0);
      if (pthNotify == (pthread_t *)0x0) {
        fd = -0x7d9;
      }
      else {
        gPigStarted = '\x01';
      }
    }
  }
  return fd;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   if ((!addrStr) || (strlen(addrStr) == 0))
   {
      addrStr = "localhost";
   }

   if (!gPigStarted)
   {
      gPigCommand = pigpioOpenSocket(addrStr, portStr);

      if (gPigCommand >= 0)
      {
         gPigNotify = pigpioOpenSocket(addrStr, portStr);

         if (gPigNotify >= 0)
         {
            gPigHandle = pigpio_command(gPigNotify, PI_CMD_NOIB, 0, 0, 1);

            if (gPigHandle < 0) return pigif_bad_noib;
            else
            {
               gLastLevel = read_bank_1();

               pthNotify = start_thread(pthNotifyThread, 0);
               if (pthNotify)
               {
                  gPigStarted = 1;
                  return 0;
               }
               else return pigif_notify_failed;
            }
         }
         else return gPigNotify;
      }
      else return gPigCommand;
   }
   return 0;
}